

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfConvert.cpp
# Opt level: O0

uint Imf_3_3::floatToUint(float f)

{
  bool bVar1;
  uint uVar2;
  float in_XMM0_Da;
  
  bVar1 = anon_unknown_2::isNegative(in_XMM0_Da);
  if ((bVar1) || (bVar1 = anon_unknown_2::isNan(in_XMM0_Da), bVar1)) {
    return 0;
  }
  bVar1 = anon_unknown_2::isInfinity(in_XMM0_Da);
  if ((!bVar1) && (uVar2 = std::numeric_limits<unsigned_int>::max(), in_XMM0_Da <= (float)uVar2)) {
    return (uint)(long)in_XMM0_Da;
  }
  uVar2 = std::numeric_limits<unsigned_int>::max();
  return uVar2;
}

Assistant:

unsigned int
floatToUint (float f)
{
    if (isNegative (f) || isNan (f)) return 0;

    if (isInfinity (f) ||
        f > static_cast<float> (std::numeric_limits<unsigned int>::max ()))
        return std::numeric_limits<unsigned int>::max ();

    return static_cast<unsigned int> (f);
}